

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O0

CURLcode Curl_cpool_add_conn(Curl_easy *data,connectdata *conn)

{
  long lVar1;
  cpool *cpool_00;
  cpool *cpool;
  cpool_bundle *bundle;
  CURLcode result;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  bundle._4_4_ = CURLE_OK;
  cpool_00 = cpool_get_instance(data);
  if (cpool_00 == (cpool *)0x0) {
    data_local._4_4_ = CURLE_FAILED_INIT;
  }
  else {
    if (cpool_00 != (cpool *)0x0) {
      if ((cpool_00->share != (Curl_share *)0x0) && ((cpool_00->share->specifier & 0x20) != 0)) {
        Curl_share_lock(cpool_00->idata,CURL_LOCK_DATA_CONNECT,CURL_LOCK_ACCESS_SINGLE);
      }
      cpool_00->field_0x98 = cpool_00->field_0x98 & 0xfe | 1;
    }
    cpool = (cpool *)cpool_find_bundle(cpool_00,conn);
    if ((cpool == (cpool *)0x0) &&
       (cpool = (cpool *)cpool_add_bundle(cpool_00,conn), cpool == (cpool *)0x0)) {
      bundle._4_4_ = CURLE_OUT_OF_MEMORY;
    }
    else {
      cpool_bundle_add((cpool_bundle *)cpool,conn);
      lVar1 = cpool_00->next_connection_id;
      cpool_00->next_connection_id = lVar1 + 1;
      conn->connection_id = lVar1;
      cpool_00->num_conn = cpool_00->num_conn + 1;
    }
    if (((cpool_00 != (cpool *)0x0) &&
        (cpool_00->field_0x98 = cpool_00->field_0x98 & 0xfe, cpool_00->share != (Curl_share *)0x0))
       && ((cpool_00->share->specifier & 0x20) != 0)) {
      Curl_share_unlock(cpool_00->idata,CURL_LOCK_DATA_CONNECT);
    }
    data_local._4_4_ = bundle._4_4_;
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_cpool_add_conn(struct Curl_easy *data,
                             struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct cpool_bundle *bundle = NULL;
  struct cpool *cpool = cpool_get_instance(data);
  DEBUGASSERT(conn);

  DEBUGASSERT(cpool);
  if(!cpool)
    return CURLE_FAILED_INIT;

  CPOOL_LOCK(cpool);
  bundle = cpool_find_bundle(cpool, conn);
  if(!bundle) {
    bundle = cpool_add_bundle(cpool, conn);
    if(!bundle) {
      result = CURLE_OUT_OF_MEMORY;
      goto out;
    }
  }

  cpool_bundle_add(bundle, conn);
  conn->connection_id = cpool->next_connection_id++;
  cpool->num_conn++;
  DEBUGF(infof(data, "Added connection %" FMT_OFF_T ". "
               "The cache now contains %zu members",
               conn->connection_id, cpool->num_conn));
out:
  CPOOL_UNLOCK(cpool);

  return result;
}